

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

TypedExpectation<void_(unsigned_short,_unsigned_char)> * __thiscall
testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
          (MockSpec<void_(unsigned_short,_unsigned_char)> *this,char *file,int line,char *obj,
          char *call)

{
  int line_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TypedExpectation<void_(unsigned_short,_unsigned_char)> *pTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string source_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"EXPECT_CALL(","");
  local_b4 = line;
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90,obj);
  local_70._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,", ");
  local_50._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar3) {
    local_50.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,call);
  paVar3 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar4 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar4) {
    local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,")");
  local_b0._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar4 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar4) {
    local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  line_00 = local_b4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_d8," invoked");
  LogWithLocation(kInfo,file,line_00,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = FunctionMocker<void_(unsigned_short,_unsigned_char)>::AddNewExpectation
                     (this->function_mocker_,file,line_00,&local_b0,&this->matchers_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return pTVar2;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const std::string source_text(std::string("EXPECT_CALL(") + obj + ", " +
                                  call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }